

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall fasttext::BinaryLogisticLoss::computeOutput(BinaryLogisticLoss *this,State *state)

{
  int64_t iVar1;
  real *prVar2;
  Vector *in_RSI;
  Matrix *in_RDI;
  Vector *unaff_retaddr;
  int32_t i;
  int32_t osz;
  Vector *output;
  undefined4 in_stack_ffffffffffffffc8;
  real in_stack_ffffffffffffffcc;
  Loss *this_00;
  int local_20;
  Matrix *A;
  
  this_00 = (Loss *)(in_RSI + 2);
  A = in_RDI;
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_RDI);
  Vector::mul(unaff_retaddr,A,in_RSI);
  iVar1 = Vector::size((Vector *)0x1cfea9);
  for (local_20 = 0; local_20 < (int)iVar1; local_20 = local_20 + 1) {
    Vector::operator[]((Vector *)in_RDI,
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffcc = Loss::sigmoid(this_00,(real)((ulong)in_RDI >> 0x20));
    prVar2 = Vector::operator[]((Vector *)in_RDI,
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    *prVar2 = in_stack_ffffffffffffffcc;
  }
  return;
}

Assistant:

void BinaryLogisticLoss::computeOutput(Model::State& state) const {
  Vector& output = state.output;
  output.mul(*wo_, state.hidden);
  int32_t osz = output.size();
  for (int32_t i = 0; i < osz; i++) {
    output[i] = sigmoid(output[i]);
  }
}